

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void> *this,char *testcase
          ,char *name,size_t index)

{
  TestCase *pTVar1;
  iuFactory<iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char32_t>_>
  *factory;
  
  pTVar1 = AddTestCase(testcase,index);
  (this->m_mediator).super_iuITestCaseMediator.m_test_case = pTVar1;
  (this->m_mediator).super_iuITestCaseMediator._vptr_iuITestCaseMediator =
       (_func_int **)&PTR__iuITestCaseMediator_002abfd0;
  TestInfo::TestInfo(&this->m_info,(iuITestCaseMediator *)this,name,
                     &(this->m_factory).super_iuFactoryBase);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_002ba220;
  pTVar1 = TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
           ::EachTest<iutest::detail::VariadicTypeList<char32_t>,_void>::AddTestCase
                     (testcase,index + 1);
  (this->m_next).m_mediator.super_iuITestCaseMediator.m_test_case = pTVar1;
  (this->m_next).m_mediator.super_iuITestCaseMediator._vptr_iuITestCaseMediator =
       (_func_int **)&PTR__iuITestCaseMediator_002abfd0;
  factory = &(this->m_next).m_factory;
  TestInfo::TestInfo(&(this->m_next).m_info,(iuITestCaseMediator *)&this->m_next,name,
                     &factory->super_iuFactoryBase);
  (factory->super_iuFactoryBase)._vptr_iuFactoryBase = (_func_int **)&PTR__iuFactoryBase_002ba2b8;
  return;
}

Assistant:

EachTest(const char* testcase, const char* name, size_t index)
            : m_mediator(AddTestCase(testcase, index))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testcase, name, index+1)
        {
        }